

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.hpp
# Opt level: O2

void __thiscall OpenMD::NPA::NPA(NPA *this,SimInfo *info)

{
  NPT::NPT(&this->super_NPT,info);
  (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__NPA_002bff68;
  SquareMatrix<double,_3>::SquareMatrix(&(this->eta).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->oldEta).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->prevEta).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->vScale).super_SquareMatrix<double,_3>);
  return;
}

Assistant:

NPA(SimInfo* info) : NPT(info) {}